

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O0

void sendOneToEachWriterRank(SstStream Stream,CMFormat f,void *Msg,void **WS_StreamPtr)

{
  uint uVar1;
  CMConnection p_Var2;
  int iVar3;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  SstStream in_RDI;
  CMConnection conn_1;
  int peer_1;
  CMConnection conn;
  int peer;
  int i;
  int local_24;
  
  if (in_RDI->WriterConfigParams->CPCommPattern == 1) {
    for (local_24 = 0; in_RDI->Peers[local_24] != -1; local_24 = local_24 + 1) {
      uVar1 = in_RDI->Peers[local_24];
      p_Var2 = in_RDI->ConnectionsToWriter[(int)uVar1].CMconn;
      *in_RCX = in_RDI->ConnectionsToWriter[(int)uVar1].RemoteStreamID;
      iVar3 = CMwrite(p_Var2,in_RSI,in_RDX);
      if ((iVar3 != 1) && (in_RDI->Status < PeerClosed)) {
        CP_verbose(in_RDI,CriticalVerbose,"Message failed to send to writer %d (%p)\n",(ulong)uVar1,
                   *in_RCX);
      }
    }
  }
  else if (in_RDI->Rank == 0) {
    p_Var2 = in_RDI->ConnectionsToWriter->CMconn;
    *in_RCX = in_RDI->ConnectionsToWriter->RemoteStreamID;
    iVar3 = CMwrite(p_Var2,in_RSI,in_RDX);
    if ((iVar3 != 1) && (in_RDI->Status < PeerClosed)) {
      CP_verbose(in_RDI,CriticalVerbose,"Message failed to send to writer %d (%p)\n",0,*in_RCX);
    }
  }
  return;
}

Assistant:

static void sendOneToEachWriterRank(SstStream Stream, CMFormat f, void *Msg, void **WS_StreamPtr)
{
    if (Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer)
    {
        int i = 0;
        while (Stream->Peers[i] != -1)
        {
            int peer = Stream->Peers[i];
            CMConnection conn = Stream->ConnectionsToWriter[peer].CMconn;
            /* add the writer Stream identifier to each outgoing
             * message */
            *WS_StreamPtr = Stream->ConnectionsToWriter[peer].RemoteStreamID;
            if (CMwrite(conn, f, Msg) != 1)
            {
                switch (Stream->Status)
                {
                case NotOpen:
                case Opening:
                case Established:
                    CP_verbose(Stream, CriticalVerbose,
                               "Message failed to send to writer %d (%p)\n", peer,
                               (void *)*WS_StreamPtr);
                    break;
                case PeerClosed:
                case PeerFailed:
                case Closed:
                case Destroyed:
                    // Don't warn on send failures for closing/closed clients
                    break;
                }
            }
            i++;
        }
    }
    else
    {
        if (Stream->Rank == 0)
        {
            int peer = 0;
            CMConnection conn = Stream->ConnectionsToWriter[peer].CMconn;
            /* add the writer Stream identifier to each outgoing
             * message */
            *WS_StreamPtr = Stream->ConnectionsToWriter[peer].RemoteStreamID;
            if (CMwrite(conn, f, Msg) != 1)
            {
                switch (Stream->Status)
                {
                case NotOpen:
                case Opening:
                case Established:
                    CP_verbose(Stream, CriticalVerbose,
                               "Message failed to send to writer %d (%p)\n", peer,
                               (void *)*WS_StreamPtr);
                    break;
                case PeerClosed:
                case PeerFailed:
                case Closed:
                case Destroyed:
                    // Don't warn on send failures for closing/closed clients
                    break;
                }
            }
        }
    }
}